

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O2

Tensor<3> * Omega_h::maxdet_metric<3,4>(Few<Omega_h::Matrix<3,_3>,_4> ms)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  double *in_RDI;
  double *pdVar12;
  double dVar13;
  Real h;
  Real g;
  double dVar14;
  Real g_1;
  Real i;
  Real c;
  Real c_1;
  
  pdVar11 = (double *)&ms;
  pdVar12 = in_RDI;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *pdVar12 = *pdVar11;
    pdVar11 = pdVar11 + 1;
    pdVar12 = pdVar12 + 1;
  }
  dVar13 = (((in_RDI[1] * in_RDI[6] * in_RDI[5] +
             *in_RDI * in_RDI[4] * in_RDI[8] + in_RDI[3] * in_RDI[7] * in_RDI[2]) -
            in_RDI[4] * in_RDI[6] * in_RDI[2]) - in_RDI[1] * in_RDI[3] * in_RDI[8]) -
           in_RDI[7] * *in_RDI * in_RDI[5];
  for (lVar9 = 0; lVar9 != 0xd8; lVar9 = lVar9 + 0x48) {
    dVar14 = *(double *)
              ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                     array_ + lVar9);
    dVar1 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                    array_ + lVar9 + 8);
    dVar2 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                    array_ + lVar9 + 0x10);
    dVar3 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.
                    array_ + lVar9);
    dVar4 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.
                    array_ + lVar9 + 8);
    dVar5 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.
                    array_ + lVar9 + 0x10);
    dVar6 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.
                    array_ + lVar9);
    dVar7 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.
                    array_ + lVar9 + 8);
    dVar8 = *(double *)
             ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.
                    array_ + lVar9 + 0x10);
    dVar14 = (((dVar1 * dVar6 * dVar5 + dVar14 * dVar4 * dVar8 + dVar3 * dVar7 * dVar2) -
              dVar4 * dVar6 * dVar2) - dVar1 * dVar3 * dVar8) - dVar7 * dVar14 * dVar5;
    if (dVar13 < dVar14) {
      pdVar11 = (double *)
                ((long)ms.array_[1].super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                       array_ + lVar9);
      pdVar12 = in_RDI;
      for (lVar10 = 9; dVar13 = dVar14, lVar10 != 0; lVar10 = lVar10 + -1) {
        *pdVar12 = *pdVar11;
        pdVar11 = pdVar11 + 1;
        pdVar12 = pdVar12 + 1;
      }
    }
  }
  return (Tensor<3> *)in_RDI;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> maxdet_metric(Few<Tensor<dim>, n> const ms) {
  auto m = ms[0];
  auto maxdet = determinant(m);
  for (Int i = 1; i < n; ++i) {
    auto det = determinant(ms[i]);
    if (det > maxdet) {
      m = ms[i];
      maxdet = det;
    }
  }
  return m;
}